

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Character.hpp
# Opt level: O2

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
njoy::tools::disco::Character<66u>::
read<std::__cxx11::string,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__
          ,Character<66u> *this,
          __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *iter,__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *param_2)

{
  bool bVar1;
  int iVar2;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
  iVar2 = 0x43;
  while( true ) {
    if (iVar2 == 1) break;
    bVar1 = isNewLine<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
                      ((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)this);
    if ((bVar1) || (**(char **)this == -1)) break;
    *(char **)this = *(char **)this + 1;
    std::__cxx11::string::push_back((char)__return_storage_ptr__);
    iVar2 = iVar2 + -1;
  }
  while (iVar2 = iVar2 + -1, iVar2 != 0) {
    std::__cxx11::string::push_back((char)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

static Representation read( Iterator& iter, const Iterator& ) {

    Representation value;
    value.reserve( Width );

    unsigned int position = 0;
    while( position < Width && ! ( isNewLine( iter ) || isEndOfFile( iter ) ) ) {

      ++position;
      value.push_back( *iter++ );
    }
    while ( position < Width ) {

      ++position;
      value.push_back( ' ' );
    }

    return value;
  }